

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O2

MPP_RET avs2d_fill_parameters(Avs2dCtx_t *p_dec,Avs2dSyntax_t *syntax)

{
  RK_U8 RVar1;
  byte bVar2;
  Avs2dFrame_t *pAVar3;
  uint3 uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ushort uVar10;
  ushort uVar11;
  undefined1 uVar12;
  RK_U8 RVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined2 uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  RK_S32 RVar36;
  
  uVar35 = *(ulong *)&syntax->pp;
  uVar30 = (ulong)((p_dec->vsh).chroma_format & 3);
  *(ulong *)&syntax->pp = uVar35 & 0xfffffffffffffffc | uVar30;
  uVar31 = (ulong)((p_dec->vsh).horizontal_size * 4 + 0x1c & 0x3ffe0);
  *(ulong *)&syntax->pp = uVar35 & 0xfffffffffffc0000 | uVar30 | uVar31;
  uVar32 = (ulong)((p_dec->vsh).vertical_size + 7 & 0xfff8) << 0x20;
  *(ulong *)&syntax->pp = uVar35 & 0xffff0000fffc0000 | uVar30 | uVar31 | uVar32;
  uVar16 = (ulong)((p_dec->vsh).bit_depth & 7) << 0x30;
  *(ulong *)&syntax->pp = uVar35 & 0xfff80000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16;
  uVar17 = (ulong)((p_dec->vsh).bit_depth & 7) << 0x33;
  *(ulong *)&syntax->pp = uVar35 & 0xffc00000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17;
  uVar18 = (ulong)((p_dec->vsh).lcu_size & 7) << 0x36;
  *(ulong *)&syntax->pp =
       uVar35 & 0xfe000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18;
  uVar19 = (ulong)((p_dec->vsh).progressive_sequence & 1) << 0x39;
  *(ulong *)&syntax->pp =
       uVar35 & 0xfc000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19;
  uVar20 = (ulong)((p_dec->vsh).field_coded_sequence & 1) << 0x3a;
  *(ulong *)&syntax->pp =
       uVar35 & 0xf8000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19 |
       uVar20;
  uVar21 = (ulong)((p_dec->vsh).enable_mhp_skip & 1) << 0x3b;
  *(ulong *)&syntax->pp =
       uVar35 & 0xf0000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19 |
       uVar20 | uVar21;
  uVar22 = (ulong)((p_dec->vsh).enable_dhp & 1) << 0x3c;
  *(ulong *)&syntax->pp =
       uVar35 & 0xe0000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19 |
       uVar20 | uVar21 | uVar22;
  uVar23 = (ulong)((p_dec->vsh).enable_wsm & 1) << 0x3d;
  *(ulong *)&syntax->pp =
       uVar35 & 0xc0000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19 |
       uVar20 | uVar21 | uVar22 | uVar23;
  uVar24 = (ulong)((p_dec->vsh).enable_amp & 1) << 0x3e;
  *(ulong *)&syntax->pp =
       uVar35 & 0x80000000fffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19 |
       uVar20 | uVar21 | uVar22 | uVar23 | uVar24;
  *(ulong *)&syntax->pp =
       uVar35 & 0xfffc0000 | uVar30 | uVar31 | uVar32 | uVar16 | uVar17 | uVar18 | uVar19 | uVar20 |
       uVar21 | uVar22 | uVar23 | uVar24 | (ulong)(p_dec->vsh).enable_nsqt << 0x3f;
  uVar4 = *(uint3 *)&(syntax->pp).field_0x8;
  uVar15 = (p_dec->vsh).enable_nsip & 1;
  *(ushort *)&(syntax->pp).field_0x8 = (ushort)uVar4 & 0xfffe | (ushort)uVar15;
  uVar15 = (uVar4 & 0xfffffffc | uVar15) + ((p_dec->vsh).enable_2nd_transform & 1) * 2;
  *(short *)&(syntax->pp).field_0x8 = (short)uVar15;
  uVar15 = (uVar15 & 0xfffffffb) + ((p_dec->vsh).enable_sao & 1) * 4;
  *(short *)&(syntax->pp).field_0x8 = (short)uVar15;
  uVar15 = (uVar15 & 0xfffffff7) + ((p_dec->vsh).enable_alf & 1) * 8;
  uVar14 = (ushort)uVar15;
  *(ushort *)&(syntax->pp).field_0x8 = uVar14;
  uVar26 = ((p_dec->vsh).enable_pmvr & 1) << 4;
  uVar5 = (ushort)uVar26;
  *(ushort *)&(syntax->pp).field_0x8 = uVar14 & 0xffef | uVar5;
  uVar27 = ((p_dec->vsh).enable_clf & 1) << 5;
  uVar6 = (ushort)uVar27;
  *(ushort *)&(syntax->pp).field_0x8 = uVar14 & 0xffcf | uVar5 | uVar6;
  uVar28 = ((p_dec->ph).picture_type & (S_PICTURE|P_PICTURE)) << 6;
  uVar10 = (ushort)uVar28;
  *(ushort *)&(syntax->pp).field_0x8 = uVar14 & 0xfe0f | uVar5 | uVar6 | uVar10;
  uVar29 = ((p_dec->ph).background_reference_flag & 1) << 9;
  uVar11 = (ushort)uVar29;
  *(ushort *)&(syntax->pp).field_0x8 =
       (ushort)(uVar15 & 0xfffffc0f) | uVar5 | uVar6 | uVar10 | uVar11;
  if ((p_dec->vsh).field_coded_sequence == '\0') {
    uVar33 = 0;
  }
  else {
    uVar33 = (uint)((p_dec->ph).is_top_field == '\0') << 10;
  }
  uVar12 = (undefined1)((uVar15 & 0xfffffc0f) >> 0x10);
  (syntax->pp).field_0xa = uVar12;
  *(ushort *)&(syntax->pp).field_0x8 =
       uVar14 & 0xf80f | uVar5 | uVar6 | uVar10 | uVar11 | (ushort)uVar33;
  uVar34 = ((p_dec->ph).fixed_picture_qp & 1) << 0xb;
  (syntax->pp).field_0xa = uVar12;
  *(ushort *)&(syntax->pp).field_0x8 =
       uVar14 & 0xf00f | uVar5 | uVar6 | uVar10 | uVar11 | (ushort)uVar33 | (ushort)uVar34;
  uVar15 = uVar15 & 0xfff8000f | uVar26 | uVar27 | uVar28 | uVar29 | uVar33 | uVar34 |
           ((p_dec->ph).picture_qp & 0x7f) << 0xc;
  uVar25 = (undefined2)uVar15;
  *(undefined2 *)&(syntax->pp).field_0x8 = uVar25;
  RVar1 = (p_dec->ph).enable_loop_filter;
  *(undefined2 *)&(syntax->pp).field_0x8 = uVar25;
  (syntax->pp).field_0xa =
       (byte)(uVar15 >> 0x10) & 0xf7 | (byte)(((uint)(RVar1 == '\0') << 0x13) >> 0x10);
  (syntax->pp).alpha_c_offset = (p_dec->ph).alpha_c_offset;
  (syntax->pp).beta_offset = (p_dec->ph).beta_offset;
  (syntax->pp).cur_poc = (p_dec->ph).poi;
  (syntax->refp).ref_pic_num = (p_dec->frm_mgr).num_of_ref;
  (syntax->refp).ref_poc_list[0] = -1;
  (syntax->refp).ref_poc_list[1] = -1;
  (syntax->refp).ref_poc_list[2] = -1;
  (syntax->refp).ref_poc_list[3] = -1;
  (syntax->refp).ref_poc_list[4] = -1;
  (syntax->refp).ref_poc_list[5] = -1;
  (syntax->refp).ref_poc_list[6] = -1;
  (syntax->refp).ref_poc_list[7] = -1;
  (syntax->refp).ref_poc_list[8] = -1;
  (syntax->refp).ref_poc_list[9] = -1;
  (syntax->refp).ref_poc_list[10] = -1;
  (syntax->refp).ref_poc_list[0xb] = -1;
  (syntax->refp).ref_poc_list[0xc] = -1;
  (syntax->refp).ref_poc_list[0xd] = -1;
  (syntax->refp).ref_poc_list[0xe] = -1;
  (syntax->refp).ref_poc_list[0xf] = -1;
  (syntax->refp).ref_poc_list[0x10] = -1;
  (syntax->refp).ref_poc_list[0x11] = -1;
  (syntax->refp).ref_poc_list[0x12] = -1;
  (syntax->refp).ref_poc_list[0x13] = -1;
  (syntax->refp).ref_poc_list[0x14] = -1;
  (syntax->refp).ref_poc_list[0x15] = -1;
  (syntax->refp).ref_poc_list[0x16] = -1;
  (syntax->refp).ref_poc_list[0x17] = -1;
  (syntax->refp).ref_poc_list[0x18] = -1;
  (syntax->refp).ref_poc_list[0x19] = -1;
  (syntax->refp).ref_poc_list[0x1a] = -1;
  (syntax->refp).ref_poc_list[0x1b] = -1;
  (syntax->refp).ref_poc_list[0x1c] = -1;
  (syntax->refp).ref_poc_list[0x1d] = -1;
  (syntax->refp).ref_poc_list[0x1e] = -1;
  (syntax->refp).ref_poc_list[0x1f] = -1;
  bVar2 = (p_dec->frm_mgr).num_of_ref;
  for (uVar35 = 0; bVar2 != uVar35; uVar35 = uVar35 + 1) {
    pAVar3 = (p_dec->frm_mgr).refs[uVar35];
    RVar36 = -1;
    if (pAVar3 != (Avs2dFrame_t *)0x0) {
      RVar36 = pAVar3->poi;
    }
    (syntax->refp).ref_poc_list[uVar35] = RVar36;
  }
  (syntax->alfp).enable_pic_alf_y = (p_dec->ph).enable_pic_alf_y;
  (syntax->alfp).enable_pic_alf_cb = (p_dec->ph).enable_pic_alf_cb;
  (syntax->alfp).enable_pic_alf_cr = (p_dec->ph).enable_pic_alf_cr;
  RVar1 = (p_dec->ph).alf_filter_num;
  RVar13 = RVar1 + 0xff;
  if (RVar1 == '\0') {
    RVar13 = '\0';
  }
  (syntax->alfp).alf_filter_num_minus1 = RVar13;
  uVar7 = *(undefined8 *)((p_dec->ph).alf_coeff_idx_tab + 8);
  *(undefined8 *)(syntax->alfp).alf_coeff_idx_tab = *(undefined8 *)(p_dec->ph).alf_coeff_idx_tab;
  *(undefined8 *)((syntax->alfp).alf_coeff_idx_tab + 8) = uVar7;
  memcpy((syntax->alfp).alf_coeff_y,(p_dec->ph).alf_coeff_y,0x240);
  (syntax->alfp).alf_coeff_cb[8] = (p_dec->ph).alf_coeff_cb[8];
  uVar7 = *(undefined8 *)(p_dec->ph).alf_coeff_cb;
  uVar8 = *(undefined8 *)((p_dec->ph).alf_coeff_cb + 2);
  uVar9 = *(undefined8 *)((p_dec->ph).alf_coeff_cb + 6);
  *(undefined8 *)((syntax->alfp).alf_coeff_cb + 4) = *(undefined8 *)((p_dec->ph).alf_coeff_cb + 4);
  *(undefined8 *)((syntax->alfp).alf_coeff_cb + 6) = uVar9;
  *(undefined8 *)(syntax->alfp).alf_coeff_cb = uVar7;
  *(undefined8 *)((syntax->alfp).alf_coeff_cb + 2) = uVar8;
  uVar7 = *(undefined8 *)(p_dec->ph).alf_coeff_cr;
  uVar8 = *(undefined8 *)((p_dec->ph).alf_coeff_cr + 2);
  uVar9 = *(undefined8 *)((p_dec->ph).alf_coeff_cr + 6);
  *(undefined8 *)((syntax->alfp).alf_coeff_cr + 4) = *(undefined8 *)((p_dec->ph).alf_coeff_cr + 4);
  *(undefined8 *)((syntax->alfp).alf_coeff_cr + 6) = uVar9;
  *(undefined8 *)(syntax->alfp).alf_coeff_cr = uVar7;
  *(undefined8 *)((syntax->alfp).alf_coeff_cr + 2) = uVar8;
  (syntax->alfp).alf_coeff_cr[8] = (p_dec->ph).alf_coeff_cr[8];
  (syntax->wqmp).pic_weight_quant_enable_flag = p_dec->enable_wq;
  (syntax->wqmp).chroma_quant_param_delta_cb = (p_dec->ph).chroma_quant_param_delta_cb;
  (syntax->wqmp).chroma_quant_param_delta_cr = (p_dec->ph).chroma_quant_param_delta_cr;
  memcpy((syntax->wqmp).wq_matrix,p_dec->cur_wq_matrix,0x200);
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_fill_parameters(Avs2dCtx_t *p_dec, Avs2dSyntax_t *syntax)
{
    RK_S32 i = 0;
    Avs2dSeqHeader_t *vsh = &p_dec->vsh;
    Avs2dPicHeader_t *ph  = &p_dec->ph;
    Avs2dFrameMgr_t *mgr  = &p_dec->frm_mgr;
    PicParams_Avs2d *pp   = &syntax->pp;
    RefParams_Avs2d *refp = &syntax->refp;
    AlfParams_Avs2d *alfp = &syntax->alfp;
    WqmParams_Avs2d *wqmp = &syntax->wqmp;

    //!< sequence header
    pp->chroma_format_idc          = vsh->chroma_format;
    pp->pic_width_in_luma_samples  = MPP_ALIGN(vsh->horizontal_size, 8);
    pp->pic_height_in_luma_samples = MPP_ALIGN(vsh->vertical_size, 8);
    pp->bit_depth_luma_minus8      = vsh->bit_depth - 8;
    pp->bit_depth_chroma_minus8    = vsh->bit_depth - 8;
    pp->lcu_size                   = vsh->lcu_size;
    pp->progressive_sequence       = vsh->progressive_sequence;
    pp->field_coded_sequence       = vsh->field_coded_sequence;
    pp->multi_hypothesis_skip_enable_flag        = vsh->enable_mhp_skip;
    pp->dual_hypothesis_prediction_enable_flag   = vsh->enable_dhp;
    pp->weighted_skip_enable_flag                = vsh->enable_wsm;
    pp->asymmetrc_motion_partitions_enable_flag  = vsh->enable_amp;
    pp->nonsquare_quadtree_transform_enable_flag = vsh->enable_nsqt;
    pp->nonsquare_intra_prediction_enable_flag   = vsh->enable_nsip;
    pp->secondary_transform_enable_flag          = vsh->enable_2nd_transform;
    pp->sample_adaptive_offset_enable_flag       = vsh->enable_sao;
    pp->adaptive_loop_filter_enable_flag         = vsh->enable_alf;
    pp->pmvr_enable_flag                         = vsh->enable_pmvr;
    pp->cross_slice_loopfilter_enable_flag       = vsh->enable_clf;

    //!< picture header
    pp->picture_type                = ph->picture_type;
    pp->scene_reference_enable_flag = ph->background_reference_flag;
    pp->bottom_field_picture_flag   = (vsh->field_coded_sequence) && (!ph->is_top_field);
    // pp->bottom_field_picture_flag   = !ph->is_top_field;
    pp->fixed_picture_qp            = ph->fixed_picture_qp;
    pp->picture_qp                  = ph->picture_qp;
    pp->loop_filter_disable_flag    = !ph->enable_loop_filter;
    pp->alpha_c_offset              = ph->alpha_c_offset;
    pp->beta_offset                 = ph->beta_offset;

    //!< current poc
    pp->cur_poc = ph->poi;

    //!< picture reference params
    refp->ref_pic_num = mgr->num_of_ref;
    memset(refp->ref_poc_list, -1, sizeof(refp->ref_poc_list));
    for (i = 0; i < mgr->num_of_ref; i++) {
        refp->ref_poc_list[i] = mgr->refs[i] ? mgr->refs[i]->poi : -1;
    }

    //!< picture alf params
    alfp->enable_pic_alf_y  = ph->enable_pic_alf_y;
    alfp->enable_pic_alf_cb = ph->enable_pic_alf_cb;
    alfp->enable_pic_alf_cr = ph->enable_pic_alf_cr;
    alfp->alf_filter_num_minus1 = (ph->alf_filter_num > 0) ? (ph->alf_filter_num - 1) : 0;
    memcpy(alfp->alf_coeff_idx_tab, ph->alf_coeff_idx_tab, sizeof(ph->alf_coeff_idx_tab));
    memcpy(alfp->alf_coeff_y, ph->alf_coeff_y, sizeof(ph->alf_coeff_y));
    memcpy(alfp->alf_coeff_cb, ph->alf_coeff_cb, sizeof(ph->alf_coeff_cb));
    memcpy(alfp->alf_coeff_cr, ph->alf_coeff_cr, sizeof(ph->alf_coeff_cr));

    //!< picture wqm params
    wqmp->pic_weight_quant_enable_flag = p_dec->enable_wq;
    wqmp->chroma_quant_param_delta_cb = ph->chroma_quant_param_delta_cb;
    wqmp->chroma_quant_param_delta_cr = ph->chroma_quant_param_delta_cr;
    memcpy(wqmp->wq_matrix, p_dec->cur_wq_matrix, sizeof(p_dec->cur_wq_matrix));

    return MPP_OK;
}